

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::add_plain_member_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRType *ib_type,
          SPIRVariable *var,SPIRType *var_type,uint32_t mbr_idx,InterfaceBlockMeta *meta,
          string *mbr_name_qual,string *var_chain_qual,uint32_t *location,uint32_t *var_mbr_idx)

{
  char *pcVar1;
  size_t sVar2;
  pointer pcVar3;
  Variant *pVVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  uint32_t uVar11;
  uint32_t type_id;
  uint32_t uVar12;
  const_iterator cVar13;
  long *plVar14;
  SPIRType *pSVar15;
  const_iterator cVar16;
  mapped_type *pmVar17;
  undefined8 *puVar18;
  ulong uVar19;
  SPIRConstant *pSVar20;
  ID **ppIVar21;
  size_type *psVar22;
  undefined8 uVar23;
  CompilerMSL *this_00;
  undefined1 auVar24 [8];
  ID *pIVar25;
  char (*ts_2) [2];
  BuiltIn builtin;
  string var_chain;
  string qual_var_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string mbr_name;
  bool local_2a5;
  bool local_2a3;
  BuiltIn local_29c;
  CompilerMSL *local_298;
  size_t local_290;
  uint32_t local_284;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_280;
  _Any_data local_278;
  ID *local_268;
  code *pcStack_260;
  SPIRFunction *local_258;
  string local_250;
  string local_230;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *local_210;
  undefined1 local_208 [8];
  CompilerMSL *pCStack_200;
  undefined1 local_1f8 [8];
  undefined1 local_1f0 [8];
  ID aIStack_1e8 [2];
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined1 local_1d0 [8];
  Variant *pVStack_1c8;
  ID *pIStack_1c0;
  Variant local_1b8;
  SmallVector<bool,_8UL> local_198;
  ID *local_178;
  uint32_t uStack_170;
  uint32_t uStack_16c;
  uint32_t uStack_168;
  char acStack_164 [12];
  undefined1 local_158 [56];
  SmallVector<unsigned_int,_8UL> local_120;
  TypeID local_e8;
  Dim DStack_e4;
  undefined4 uStack_e0;
  uint32_t uStack_dc;
  float local_d8;
  AccessQualifier AStack_d4;
  TypeID TStack_d0;
  TypeID TStack_cc;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  _Stack_c8;
  string local_90;
  string local_70;
  string local_50;
  
  local_298 = (CompilerMSL *)var;
  local_258 = Variant::get<spirv_cross::SPIRFunction>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr +
                         (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  local_29c = BuiltInMax;
  bVar5 = Compiler::is_member_builtin((Compiler *)this,var_type,mbr_idx,&local_29c);
  bVar6 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,
                     DecorationFlat);
  local_2a5 = true;
  bVar7 = true;
  if (!bVar6) {
    bVar7 = Compiler::has_decoration
                      ((Compiler *)this,
                       (ID)*(uint32_t *)
                            &(local_298->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
                             super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                             .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>.
                             _M_head_impl,DecorationFlat);
  }
  bVar6 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,
                     DecorationNoPerspective);
  if (!bVar6) {
    local_2a5 = Compiler::has_decoration
                          ((Compiler *)this,
                           (ID)*(uint32_t *)
                                &(local_298->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
                                 super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                                 .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>.
                                 _M_head_impl,DecorationNoPerspective);
  }
  bVar6 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,Centroid);
  local_2a3 = true;
  bVar8 = true;
  if (!bVar6) {
    bVar8 = Compiler::has_decoration
                      ((Compiler *)this,
                       (ID)*(uint32_t *)
                            &(local_298->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
                             super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                             .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>.
                             _M_head_impl,Centroid);
  }
  bVar6 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,
                     DecorationSample);
  if (!bVar6) {
    local_2a3 = Compiler::has_decoration
                          ((Compiler *)this,
                           (ID)*(uint32_t *)
                                &(local_298->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
                                 super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                                 .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>.
                                 _M_head_impl,DecorationSample);
  }
  local_210 = &ib_type->member_types;
  local_290 = (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
              .buffer_size;
  uVar11 = ensure_correct_builtin_type
                     (this,(var_type->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                           [mbr_idx].id,local_29c);
  (var_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
  [mbr_idx].id = uVar11;
  local_284 = uVar11;
  if (storage == Input) {
    local_208._0_4_ =
         *(undefined4 *)
          &(local_298->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
           super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           ._M_t.
           super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
    cVar13 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::find(&(this->pull_model_inputs)._M_h,(key_type *)local_208);
    if (cVar13.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
      uVar11 = build_msl_interpolant_type(this,local_284,local_2a5);
    }
  }
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
            (local_210,
             (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
             buffer_size + 1);
  sVar2 = (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
          buffer_size;
  (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[sVar2].
  id = uVar11;
  (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size
       = sVar2 + 1;
  ts_2 = (char (*) [2])(ulong)mbr_idx;
  append_member_name(&local_50,this,mbr_name_qual,var_type,mbr_idx);
  this_00 = (CompilerMSL *)0x37f334;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"m","");
  ensure_valid_name(&local_90,this_00,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  Compiler::set_member_name
            ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,(uint32_t)local_290,
             &local_90);
  local_208 = (undefined1  [8])local_1f8;
  pcVar3 = (ib_var_ref->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_208,pcVar3,pcVar3 + ib_var_ref->_M_string_length);
  ::std::__cxx11::string::append(local_208);
  plVar14 = (long *)::std::__cxx11::string::_M_append(local_208,(ulong)local_90._M_dataplus._M_p);
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  psVar22 = (size_type *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar22) {
    local_230.field_2._M_allocated_capacity = *psVar22;
    local_230.field_2._8_8_ = plVar14[3];
  }
  else {
    local_230.field_2._M_allocated_capacity = *psVar22;
    local_230._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_230._M_string_length = plVar14[1];
  *plVar14 = (long)psVar22;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  if (local_208 != (undefined1  [8])local_1f8) {
    operator_delete((void *)local_208);
  }
  if (storage == Input) {
    local_208._0_4_ =
         *(undefined4 *)
          &(local_298->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
           super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           ._M_t.
           super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
    cVar13 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::find(&(this->pull_model_inputs)._M_h,(key_type *)local_208);
    if (cVar13.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
      if (local_2a3 == true && bVar8 == false) {
        CompilerGLSL::to_expression_abi_cxx11_
                  (&local_250,&this->super_CompilerGLSL,this->builtin_sample_id_id,true);
        join<char_const(&)[24],std::__cxx11::string,char_const(&)[2]>
                  ((string *)local_208,(spirv_cross *)".interpolate_at_sample(",
                   (char (*) [24])&local_250,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a4196,
                   ts_2);
        ::std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_208);
        if (local_208 != (undefined1  [8])local_1f8) {
          operator_delete((void *)local_208);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p);
        }
      }
      else {
        ::std::__cxx11::string::append((char *)&local_230);
      }
    }
  }
  uVar23 = 0;
  bVar6 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,
                     DecorationLocation);
  bVar9 = Compiler::has_decoration
                    ((Compiler *)this,
                     (ID)*(uint32_t *)
                          &(local_298->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
                           super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                           .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>.
                           _M_head_impl,DecorationLocation);
  if (bVar6) {
    uVar23 = 0;
    uVar11 = Compiler::get_member_decoration
                       ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,
                        DecorationLocation);
LAB_0022465e:
    uVar12 = local_284;
    local_280 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)CONCAT44(local_280._4_4_,
                            (int)CONCAT71((int7)((ulong)uVar23 >> 8),uVar11 != 0xffffffff));
    if ((*location == 0xffffffff) && (uVar11 != 0xffffffff)) {
      *location = uVar11;
    }
    uVar11 = 0xffffffff;
    if ((bVar9 || bVar6) && storage == Input) {
      uVar11 = 0;
      if (bVar6) {
        uVar11 = Compiler::get_member_decoration
                           ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,
                            Component);
      }
      type_id = ensure_correct_input_type(this,uVar12,*location,uVar11,0,meta->strip_array);
      uVar11 = 0xffffffff;
      if (type_id != uVar12) {
        pSVar15 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr + uVar12);
        uVar11 = pSVar15->vecsize;
      }
      local_208._0_4_ =
           *(undefined4 *)
            &(local_298->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
             super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
             ._M_t.
             super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
             .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
      cVar13 = ::std::
               _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::find(&(this->pull_model_inputs)._M_h,(key_type *)local_208);
      uVar19 = local_290 & 0xffffffff;
      if (cVar13.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
        (local_210->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>).ptr[uVar19].id =
             type_id;
        local_284 = type_id;
      }
      else {
        uVar12 = build_msl_interpolant_type(this,type_id,local_2a5);
        (local_210->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>).ptr[uVar19].id =
             uVar12;
        local_284 = type_id;
      }
    }
  }
  else {
    if (bVar9) {
      uVar23 = 0;
      uVar11 = CompilerGLSL::get_accumulated_member_location
                         (&this->super_CompilerGLSL,(SPIRVariable *)local_298,mbr_idx,
                          meta->strip_array);
      goto LAB_0022465e;
    }
    uVar11 = 0xffffffff;
    if (bVar5) {
      bVar10 = Compiler::is_tessellation_shader((Compiler *)this);
      uVar23 = CONCAT71((int7)((ulong)uVar23 >> 8),storage != Input);
      if (!bVar10 || storage != Input) {
        if ((storage == Output) && (this->capture_output_to_buffer != false)) {
          local_280 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)&this->outputs_by_builtin;
          local_208._0_4_ = local_29c;
          cVar16 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)local_280,(key_type *)local_208);
          if (cVar16.
              super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_false>
              ._M_cur != (__node_type *)0x0) {
            local_208._0_4_ = local_29c;
            pmVar17 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[](local_280,(key_type *)local_208);
            goto LAB_00224822;
          }
        }
      }
      else {
        local_280 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this->inputs_by_builtin;
        local_208._0_4_ = local_29c;
        cVar16 = ::std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)local_280,(key_type *)local_208);
        if (cVar16.
            super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_false>
            ._M_cur != (__node_type *)0x0) {
          local_208._0_4_ = local_29c;
          pmVar17 = ::std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[](local_280,(key_type *)local_208);
LAB_00224822:
          uVar11 = pmVar17->location;
          goto LAB_0022465e;
        }
      }
    }
    local_280 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)((ulong)local_280 & 0xffffffff00000000);
  }
  local_208 = (undefined1  [8])local_1f8;
  pcVar3 = (var_chain_qual->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_208,pcVar3,pcVar3 + var_chain_qual->_M_string_length);
  ::std::__cxx11::string::append(local_208);
  CompilerGLSL::to_member_name_abi_cxx11_
            ((string *)&local_278,&this->super_CompilerGLSL,var_type,mbr_idx);
  pcVar1 = (pCStack_200->super_CompilerGLSL).super_Compiler.ir.ids.stack_storage.aligned_char +
           local_278._8_8_ + -0x40;
  auVar24 = (undefined1  [8])(ID *)0xf;
  if (local_208 != (undefined1  [8])local_1f8) {
    auVar24 = local_1f8;
  }
  if ((ulong)auVar24 < pcVar1) {
    pIVar25 = (ID *)0xf;
    if ((ID **)local_278._M_unused._0_8_ != &local_268) {
      pIVar25 = local_268;
    }
    if (pIVar25 < pcVar1) goto LAB_002248dc;
    puVar18 = (undefined8 *)
              ::std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,(ulong)local_208);
  }
  else {
LAB_002248dc:
    puVar18 = (undefined8 *)
              ::std::__cxx11::string::_M_append(local_208,local_278._M_unused._M_member_pointer);
  }
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  psVar22 = puVar18 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar18 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar22) {
    local_250.field_2._M_allocated_capacity = *psVar22;
    local_250.field_2._8_8_ = puVar18[3];
  }
  else {
    local_250.field_2._M_allocated_capacity = *psVar22;
    local_250._M_dataplus._M_p = (pointer)*puVar18;
  }
  local_250._M_string_length = puVar18[1];
  *puVar18 = psVar22;
  puVar18[1] = 0;
  *(undefined1 *)psVar22 = 0;
  if ((ID **)local_278._M_unused._0_8_ != &local_268) {
    operator_delete(local_278._M_unused._M_object);
  }
  if (local_208 != (undefined1  [8])local_1f8) {
    operator_delete((void *)local_208);
  }
  if ((bVar5) && ((meta->strip_array & 1U) == 0)) {
    Compiler::set_member_qualified_name
              ((Compiler *)this,(var_type->super_IVariant).self.id,mbr_idx,&local_230);
    bVar6 = false;
LAB_00224c27:
    if ((char)local_280 != '\0') {
      uVar11 = *location;
LAB_00224c50:
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,(uint32_t)local_290,
                 DecorationLocation,uVar11);
      uVar11 = *location;
      uVar19 = (ulong)local_284;
      pSVar15 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + uVar19);
      mark_location_as_used_by_shader(this,uVar11,pSVar15,storage,false);
      pSVar15 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + uVar19);
      uVar11 = CompilerGLSL::type_to_location_count(&this->super_CompilerGLSL,pSVar15);
      *location = *location + uVar11;
    }
  }
  else {
    local_1d8 = (ID *)CONCAT44(local_1d8._4_4_,(uint32_t)local_1d8);
    if (((meta->strip_array & 1U) == 0) &&
       (local_1d8 = (ID *)CONCAT44(local_1d8._4_4_,(uint32_t)local_1d8),
       meta->allow_local_declaration == true)) {
      if (storage != Output) {
        local_1d8 = (ID *)CONCAT44(local_1d8._4_4_,(uint32_t)local_1d8);
        if (storage == Input) {
          local_208._0_4_ = uVar11;
          pCStack_200 = this;
          local_1f8 = (undefined1  [8])aIStack_1e8;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1f8,local_250._M_dataplus._M_p,
                     local_250._M_dataplus._M_p + local_250._M_string_length);
          pIVar25 = (ID *)(local_1d0 + 8);
          local_1d8 = pIVar25;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1d8,local_230._M_dataplus._M_p,
                     local_230._M_dataplus._M_p + local_230._M_string_length);
          local_268 = (ID *)0x0;
          pcStack_260 = (code *)0x0;
          local_278._M_unused._M_object = (void *)0x0;
          local_278._8_8_ = 0;
          local_278._M_unused._M_object = operator_new(0x50);
          *(undefined1 (*) [8])local_278._M_unused._0_8_ = local_208;
          *(CompilerMSL **)((long)local_278._M_unused._0_8_ + 8) = pCStack_200;
          *(ID **)((long)local_278._M_unused._0_8_ + 0x10) =
               (ID *)((long)local_278._M_unused._0_8_ + 0x20);
          if (local_1f8 == (undefined1  [8])aIStack_1e8) {
            *(ID **)((long)local_278._M_unused._0_8_ + 0x20) =
                 (ID *)CONCAT44(aIStack_1e8[1].id,aIStack_1e8[0].id);
            *(ID **)((long)local_278._M_unused._0_8_ + 0x28) =
                 (ID *)CONCAT44(uStack_1e0._4_4_,(BaseType)uStack_1e0);
          }
          else {
            *(undefined1 (*) [8])((long)local_278._M_unused._0_8_ + 0x10) = local_1f8;
            *(ID **)((long)local_278._M_unused._0_8_ + 0x20) =
                 (ID *)CONCAT44(aIStack_1e8[1].id,aIStack_1e8[0].id);
          }
          *(undefined1 (*) [8])((long)local_278._M_unused._0_8_ + 0x18) = local_1f0;
          local_1f0 = (undefined1  [8])0x0;
          aIStack_1e8[0].id = aIStack_1e8[0].id & 0xffffff00;
          *(ID **)((long)local_278._M_unused._0_8_ + 0x30) =
               (ID *)((long)local_278._M_unused._0_8_ + 0x40);
          if (local_1d8 == pIVar25) {
            *(Variant **)((long)local_278._M_unused._0_8_ + 0x40) = pVStack_1c8;
            *(ID **)((long)local_278._M_unused._0_8_ + 0x48) = pIStack_1c0;
          }
          else {
            *(ID **)((long)local_278._M_unused._0_8_ + 0x30) = local_1d8;
            *(Variant **)((long)local_278._M_unused._0_8_ + 0x40) = pVStack_1c8;
          }
          *(undefined1 (*) [8])((long)local_278._M_unused._0_8_ + 0x38) = local_1d0;
          local_1d0 = (undefined1  [8])0x0;
          pVStack_1c8 = (Variant *)((ulong)pVStack_1c8 & 0xffffffffffffff00);
          pcStack_260 = ::std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:3434:40)>
                        ::_M_invoke;
          local_268 = (ID *)::std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:3434:40)>
                            ::_M_manager;
          local_1f8 = (undefined1  [8])aIStack_1e8;
          local_1d8 = pIVar25;
          SmallVector<std::function<void_()>,_0UL>::push_back
                    (&local_258->fixup_hooks_in,(function<void_()> *)&local_278);
          if (local_268 != (ID *)0x0) {
            (*(code *)local_268)(&local_278,&local_278,3);
          }
          if (local_1d8 != pIVar25) {
            operator_delete(local_1d8);
          }
          if (local_1f8 != (undefined1  [8])aIStack_1e8) {
            operator_delete((void *)local_1f8);
          }
        }
        goto LAB_00224c1d;
      }
      local_208 = (undefined1  [8])this;
      pCStack_200 = (CompilerMSL *)local_1f0;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&pCStack_200,local_230._M_dataplus._M_p,
                 local_230._M_dataplus._M_p + local_230._M_string_length);
      uStack_1e0 = (ID *)local_1d0;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&uStack_1e0,local_250._M_dataplus._M_p,
                 local_250._M_dataplus._M_p + local_250._M_string_length);
      local_268 = (ID *)0x0;
      pcStack_260 = (code *)0x0;
      local_278._M_unused._M_object = (void *)0x0;
      local_278._8_8_ = 0;
      local_278._M_unused._M_object = operator_new(0x48);
      *(undefined1 (*) [8])local_278._M_unused._0_8_ = local_208;
      *(ID **)((long)local_278._M_unused._0_8_ + 8) = (ID *)((long)local_278._M_unused._0_8_ + 0x18)
      ;
      if (pCStack_200 == (CompilerMSL *)local_1f0) {
        *(undefined1 (*) [8])((long)local_278._M_unused._0_8_ + 0x18) = local_1f0;
        *(ID **)((long)local_278._M_unused._0_8_ + 0x20) =
             (ID *)CONCAT44(aIStack_1e8[1].id,aIStack_1e8[0].id);
      }
      else {
        *(CompilerMSL **)((long)local_278._M_unused._0_8_ + 8) = pCStack_200;
        *(undefined1 (*) [8])((long)local_278._M_unused._0_8_ + 0x18) = local_1f0;
      }
      *(undefined1 (*) [8])((long)local_278._M_unused._0_8_ + 0x10) = local_1f8;
      local_1f8 = (undefined1  [8])0x0;
      local_1f0 = (undefined1  [8])((ulong)local_1f0 & 0xffffffffffffff00);
      *(ID **)((long)local_278._M_unused._0_8_ + 0x28) =
           (ID *)((long)local_278._M_unused._0_8_ + 0x38);
      if (uStack_1e0 == (ID *)local_1d0) {
        *(undefined1 (*) [8])((long)local_278._M_unused._0_8_ + 0x38) = local_1d0;
        *(Variant **)((long)local_278._M_unused._0_8_ + 0x40) = pVStack_1c8;
      }
      else {
        *(ID **)((long)local_278._M_unused._0_8_ + 0x28) = uStack_1e0;
        *(undefined1 (*) [8])((long)local_278._M_unused._0_8_ + 0x38) = local_1d0;
      }
      *(ID **)((long)local_278._M_unused._0_8_ + 0x30) =
           (ID *)CONCAT44(local_1d8._4_4_,(uint32_t)local_1d8);
      local_1d8._0_4_ = 0;
      local_1d8._4_4_ = 0;
      local_1d0 = (undefined1  [8])((ulong)local_1d0 & 0xffffffffffffff00);
      pcStack_260 = ::std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:3445:41)>
                    ::_M_invoke;
      local_268 = (ID *)::std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:3445:41)>
                        ::_M_manager;
      pCStack_200 = (CompilerMSL *)local_1f0;
      uStack_1e0 = (ID *)local_1d0;
      SmallVector<std::function<void_()>,_0UL>::push_back
                (&local_258->fixup_hooks_out,(function<void_()> *)&local_278);
      if (local_268 != (ID *)0x0) {
        (*(code *)local_268)(&local_278,&local_278,3);
      }
      if (uStack_1e0 != (ID *)local_1d0) {
        operator_delete(uStack_1e0);
      }
      if (pCStack_200 != (CompilerMSL *)local_1f0) {
        operator_delete(pCStack_200);
      }
      bVar6 = true;
    }
    else {
LAB_00224c1d:
      bVar6 = false;
    }
    if (bVar5) goto LAB_00224c27;
    uVar11 = *location;
    if (uVar11 != 0xffffffff) goto LAB_00224c50;
  }
  bVar9 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,Component);
  if (bVar9) {
    uVar11 = Compiler::get_member_decoration
                       ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,
                        Component);
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,(uint32_t)local_290,
               Component,uVar11);
  }
  if (bVar5) {
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,(uint32_t)local_290,
               BuiltIn,local_29c);
    if ((storage == Output) && (local_29c == BuiltInPosition)) {
      ::std::__cxx11::string::_M_assign((string *)&this->qual_pos_var_name);
    }
  }
  if ((((!bVar6 && *(int *)&(local_298->super_CompilerGLSL).super_Compiler.ir.spirv.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start == 3) &&
       (uVar19 = (ulong)*(uint *)((long)&(local_298->super_CompilerGLSL).super_Compiler.ir.spirv.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data + 8), uVar19 != 0)) &&
      (uVar19 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                super_VectorView<spirv_cross::Variant>.buffer_size)) &&
     (pVVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr, pVVar4[uVar19].type == TypeConstant)) {
    pSVar20 = Variant::get<spirv_cross::SPIRConstant>(pVVar4 + uVar19);
    local_258 = (SPIRFunction *)&local_258->fixup_hooks_in;
    if (meta->strip_array == true) {
      local_208 = (undefined1  [8])local_298;
      local_1f8._0_4_ = mbr_idx;
      pCStack_200 = this;
      SPIRType::SPIRType((SPIRType *)local_1f0,ib_type);
      local_268 = (ID *)0x0;
      pcStack_260 = (code *)0x0;
      local_278._M_unused._M_object = (void *)0x0;
      local_278._8_8_ = 0;
      ppIVar21 = (ID **)operator_new(0x178);
      *(undefined4 *)(ppIVar21 + 2) = local_1f8._0_4_;
      *ppIVar21 = (ID *)local_208;
      ppIVar21[1] = (ID *)pCStack_200;
      *(uint32_t *)(ppIVar21 + 4) = aIStack_1e8[0].id;
      ppIVar21[3] = (ID *)&PTR__SPIRType_0048ff28;
      *(uint32_t *)((long)ppIVar21 + 0x34) = local_1d8._4_4_;
      *(ulong *)((long)ppIVar21 + 0x24) = CONCAT44((BaseType)uStack_1e0,aIStack_1e8[1].id);
      *(ulong *)((long)ppIVar21 + 0x2c) = CONCAT44((uint32_t)local_1d8,uStack_1e0._4_4_);
      ppIVar21[8] = (ID *)0x0;
      ppIVar21[7] = (ID *)(ppIVar21 + 10);
      ppIVar21[9] = (ID *)0x8;
      SmallVector<unsigned_int,_8UL>::operator=
                ((SmallVector<unsigned_int,_8UL> *)(ppIVar21 + 7),
                 (SmallVector<unsigned_int,_8UL> *)local_1d0);
      ppIVar21[0xf] = (ID *)0x0;
      ppIVar21[0xe] = (ID *)(ppIVar21 + 0x11);
      ppIVar21[0x10] = (ID *)0x8;
      SmallVector<bool,_8UL>::operator=((SmallVector<bool,_8UL> *)(ppIVar21 + 0xe),&local_198);
      ppIVar21[0x12] = local_178;
      ppIVar21[0x13] = (ID *)CONCAT44(uStack_16c,uStack_170);
      *(ulong *)((long)ppIVar21 + 0x9c) = CONCAT44(uStack_168,uStack_16c);
      *(undefined8 *)((long)ppIVar21 + 0xa4) = acStack_164._0_8_;
      ppIVar21[0x17] = (ID *)0x0;
      ppIVar21[0x16] = (ID *)(ppIVar21 + 0x19);
      ppIVar21[0x18] = (ID *)0x8;
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
                ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)(ppIVar21 + 0x16),
                 (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)local_158);
      ppIVar21[0x1e] = (ID *)0x0;
      ppIVar21[0x1d] = (ID *)(ppIVar21 + 0x20);
      ppIVar21[0x1f] = (ID *)0x8;
      SmallVector<unsigned_int,_8UL>::operator=
                ((SmallVector<unsigned_int,_8UL> *)(ppIVar21 + 0x1d),&local_120);
      *(uint32_t *)(ppIVar21 + 0x24) = local_e8.id;
      *(Dim *)((long)ppIVar21 + 0x124) = DStack_e4;
      *(undefined4 *)(ppIVar21 + 0x25) = uStack_e0;
      *(uint32_t *)((long)ppIVar21 + 300) = uStack_dc;
      *(float *)(ppIVar21 + 0x26) = local_d8;
      *(AccessQualifier *)((long)ppIVar21 + 0x134) = AStack_d4;
      *(uint32_t *)(ppIVar21 + 0x27) = TStack_d0.id;
      *(uint32_t *)((long)ppIVar21 + 0x13c) = TStack_cc.id;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)(ppIVar21 + 0x28),&_Stack_c8,&_Stack_c8);
      pcStack_260 = ::std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:3483:40)>
                    ::_M_invoke;
      local_268 = (ID *)::std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:3483:40)>
                        ::_M_manager;
      local_278._M_unused._0_8_ = ppIVar21;
      SmallVector<std::function<void_()>,_0UL>::push_back
                ((SmallVector<std::function<void_()>,_0UL> *)local_258,
                 (function<void_()> *)&local_278);
      if (local_268 != (ID *)0x0) {
        (*(code *)local_268)(&local_278,&local_278,3);
      }
      local_1f0 = (undefined1  [8])&PTR__SPIRType_0048ff28;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&_Stack_c8);
      local_120.super_VectorView<unsigned_int>.buffer_size = 0;
      if ((AlignedBuffer<unsigned_int,_8UL> *)local_120.super_VectorView<unsigned_int>.ptr !=
          &local_120.stack_storage) {
        free(local_120.super_VectorView<unsigned_int>.ptr);
      }
      local_158._8_8_ = 0;
      if ((TypedID<(spirv_cross::Types)1> *)local_158._0_8_ !=
          (TypedID<(spirv_cross::Types)1> *)(local_158 + 0x18)) {
        free((void *)local_158._0_8_);
      }
      local_198.super_VectorView<bool>.buffer_size = 0;
      if ((AlignedBuffer<bool,_8UL> *)local_198.super_VectorView<bool>.ptr !=
          &local_198.stack_storage) {
        free(local_198.super_VectorView<bool>.ptr);
      }
      pVStack_1c8 = (Variant *)0x0;
      if (local_1d0 != (undefined1  [8])(local_1d0 + 0x18)) {
        free((void *)local_1d0);
      }
    }
    else {
      local_208 = (undefined1  [8])this;
      pCStack_200 = (CompilerMSL *)local_1f0;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&pCStack_200,local_230._M_dataplus._M_p,
                 local_230._M_dataplus._M_p + local_230._M_string_length);
      uStack_1e0._0_4_ = (BaseType)pSVar20;
      uStack_1e0._4_4_ = (uint32_t)((ulong)pSVar20 >> 0x20);
      local_1d8._0_4_ = mbr_idx;
      local_278._M_unused._M_object = (void *)0x0;
      local_278._8_8_ = 0;
      local_268 = (ID *)0x0;
      pcStack_260 = (code *)0x0;
      local_278._M_unused._M_object = operator_new(0x38);
      *(undefined1 (*) [8])local_278._M_unused._0_8_ = local_208;
      *(ID **)((long)local_278._M_unused._0_8_ + 8) = (ID *)((long)local_278._M_unused._0_8_ + 0x18)
      ;
      if (pCStack_200 == (CompilerMSL *)local_1f0) {
        *(undefined1 (*) [8])((long)local_278._M_unused._0_8_ + 0x18) = local_1f0;
        *(ID **)((long)local_278._M_unused._0_8_ + 0x20) =
             (ID *)CONCAT44(aIStack_1e8[1].id,aIStack_1e8[0].id);
      }
      else {
        *(CompilerMSL **)((long)local_278._M_unused._0_8_ + 8) = pCStack_200;
        *(undefined1 (*) [8])((long)local_278._M_unused._0_8_ + 0x18) = local_1f0;
      }
      *(undefined1 (*) [8])((long)local_278._M_unused._0_8_ + 0x10) = local_1f8;
      local_1f8 = (undefined1  [8])0x0;
      local_1f0 = (undefined1  [8])((ulong)local_1f0 & 0xffffffffffffff00);
      *(uint32_t *)((long)local_278._M_unused._0_8_ + 0x30) = (uint32_t)local_1d8;
      *(ID **)((long)local_278._M_unused._0_8_ + 0x28) =
           (ID *)CONCAT44(uStack_1e0._4_4_,(BaseType)uStack_1e0);
      pcStack_260 = ::std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:3497:40)>
                    ::_M_invoke;
      local_268 = (ID *)::std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:3497:40)>
                        ::_M_manager;
      pCStack_200 = (CompilerMSL *)local_1f0;
      SmallVector<std::function<void_()>,_0UL>::push_back
                ((SmallVector<std::function<void_()>,_0UL> *)local_258,
                 (function<void_()> *)&local_278);
      if (local_268 != (ID *)0x0) {
        (*(code *)local_268)(&local_278,&local_278,3);
      }
      if (pCStack_200 != (CompilerMSL *)local_1f0) {
        operator_delete(pCStack_200);
      }
    }
  }
  if (storage == Input) {
    local_208._0_4_ =
         *(undefined4 *)
          &(local_298->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
           super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           ._M_t.
           super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
    cVar13 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::find(&(this->pull_model_inputs)._M_h,(key_type *)local_208);
    if (cVar13.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0)
    goto LAB_002252f5;
  }
  if (bVar7 != false) {
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,(uint32_t)local_290,
               DecorationFlat,0);
  }
  if (local_2a5 != false) {
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,(uint32_t)local_290,
               DecorationNoPerspective,0);
  }
  if (bVar8 != false) {
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,(uint32_t)local_290,
               Centroid,0);
  }
  if (local_2a3 != false) {
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,(uint32_t)local_290,
               DecorationSample,0);
  }
LAB_002252f5:
  Compiler::set_extended_member_decoration
            ((Compiler *)this,(ib_type->super_IVariant).self.id,(uint32_t)local_290,
             SPIRVCrossDecorationInterfaceOrigID,
             *(uint32_t *)
              &(local_298->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
               super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
               ._M_t.
               super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
               .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl);
  Compiler::set_extended_member_decoration
            ((Compiler *)this,(ib_type->super_IVariant).self.id,(uint32_t)local_290,
             SPIRVCrossDecorationInterfaceMemberIndex,*var_mbr_idx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerMSL::add_plain_member_variable_to_interface_block(StorageClass storage,
                                                               const string &ib_var_ref, SPIRType &ib_type,
                                                               SPIRVariable &var, SPIRType &var_type,
                                                               uint32_t mbr_idx, InterfaceBlockMeta &meta,
                                                               const string &mbr_name_qual,
                                                               const string &var_chain_qual,
                                                               uint32_t &location, uint32_t &var_mbr_idx)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);

	BuiltIn builtin = BuiltInMax;
	bool is_builtin = is_member_builtin(var_type, mbr_idx, &builtin);
	bool is_flat =
	    has_member_decoration(var_type.self, mbr_idx, DecorationFlat) || has_decoration(var.self, DecorationFlat);
	bool is_noperspective = has_member_decoration(var_type.self, mbr_idx, DecorationNoPerspective) ||
	                        has_decoration(var.self, DecorationNoPerspective);
	bool is_centroid = has_member_decoration(var_type.self, mbr_idx, DecorationCentroid) ||
	                   has_decoration(var.self, DecorationCentroid);
	bool is_sample =
	    has_member_decoration(var_type.self, mbr_idx, DecorationSample) || has_decoration(var.self, DecorationSample);

	// Add a reference to the member to the interface struct.
	uint32_t mbr_type_id = var_type.member_types[mbr_idx];
	uint32_t ib_mbr_idx = uint32_t(ib_type.member_types.size());
	mbr_type_id = ensure_correct_builtin_type(mbr_type_id, builtin);
	var_type.member_types[mbr_idx] = mbr_type_id;
	if (storage == StorageClassInput && pull_model_inputs.count(var.self))
		ib_type.member_types.push_back(build_msl_interpolant_type(mbr_type_id, is_noperspective));
	else
		ib_type.member_types.push_back(mbr_type_id);

	// Give the member a name
	string mbr_name = ensure_valid_name(append_member_name(mbr_name_qual, var_type, mbr_idx), "m");
	set_member_name(ib_type.self, ib_mbr_idx, mbr_name);

	// Update the original variable reference to include the structure reference
	string qual_var_name = ib_var_ref + "." + mbr_name;
	// If using pull-model interpolation, need to add a call to the correct interpolation method.
	if (storage == StorageClassInput && pull_model_inputs.count(var.self))
	{
		if (is_centroid)
			qual_var_name += ".interpolate_at_centroid()";
		else if (is_sample)
			qual_var_name += join(".interpolate_at_sample(", to_expression(builtin_sample_id_id), ")");
		else
			qual_var_name += ".interpolate_at_center()";
	}

	// The SPIRV location of interface variable, used to obtain the initial
	// MSL location (the location variable) and interface matching
	uint32_t ir_location = UINT32_MAX;
	bool has_member_loc_decor = has_member_decoration(var_type.self, mbr_idx, DecorationLocation);
	bool has_var_loc_decor = has_decoration(var.self, DecorationLocation);
	uint32_t orig_vecsize = UINT32_MAX;

	if (has_member_loc_decor)
		ir_location = get_member_decoration(var_type.self, mbr_idx, DecorationLocation);
	else if (has_var_loc_decor)
		ir_location = get_accumulated_member_location(var, mbr_idx, meta.strip_array);
	else if (is_builtin)
	{
		if (is_tessellation_shader() && storage == StorageClassInput && inputs_by_builtin.count(builtin))
			ir_location = inputs_by_builtin[builtin].location;
		else if (capture_output_to_buffer && storage == StorageClassOutput && outputs_by_builtin.count(builtin))
			ir_location = outputs_by_builtin[builtin].location;
	}

	// Once we determine the location of the first member within nested structures,
	// from a var of the topmost structure, the remaining flattened members of
	// the nested structures will have consecutive location values. At this point,
	// we've recursively tunnelled into structs, arrays, and matrices, and are
	// down to a single location for each member now.
	if (location == UINT32_MAX && ir_location != UINT32_MAX)
		location = ir_location;

	if (storage == StorageClassInput && (has_member_loc_decor || has_var_loc_decor))
	{
		uint32_t component = 0;
		uint32_t orig_mbr_type_id = mbr_type_id;

		if (has_member_loc_decor)
			component = get_member_decoration(var_type.self, mbr_idx, DecorationComponent);

		mbr_type_id = ensure_correct_input_type(mbr_type_id, location, component, 0, meta.strip_array);

		// For members of the composite interface block, we only change the interface block type
		// when interface matching happens. In the meantime, we store the original vector size
		// and insert a swizzle when loading from metal interface block (see fixup below)
		if (mbr_type_id != orig_mbr_type_id)
			orig_vecsize = get<SPIRType>(orig_mbr_type_id).vecsize;

		if (storage == StorageClassInput && pull_model_inputs.count(var.self))
			ib_type.member_types[ib_mbr_idx] = build_msl_interpolant_type(mbr_type_id, is_noperspective);
		else
			ib_type.member_types[ib_mbr_idx] = mbr_type_id;
	}

	bool flatten_stage_out = false;
	string var_chain = var_chain_qual + "." + to_member_name(var_type, mbr_idx);
	if (is_builtin && !meta.strip_array)
	{
		// For the builtin gl_PerVertex, we cannot treat it as a block anyways,
		// so redirect to qualified name.
		set_member_qualified_name(var_type.self, mbr_idx, qual_var_name);
	}
	else if (!meta.strip_array && meta.allow_local_declaration)
	{
		// Unflatten or flatten from [[stage_in]] or [[stage_out]] as appropriate.
		switch (storage)
		{
		case StorageClassInput:
			entry_func.fixup_hooks_in.push_back([=]() {
				string swizzle;
				// Insert swizzle for widened interface block vector from interface matching
				if (orig_vecsize != UINT32_MAX)
					swizzle = vector_swizzle(orig_vecsize, 0);
				statement(var_chain, " = ", qual_var_name, swizzle, ";");
			});
			break;

		case StorageClassOutput:
			flatten_stage_out = true;
			entry_func.fixup_hooks_out.push_back([=]() {
				statement(qual_var_name, " = ", var_chain, ";");
			});
			break;

		default:
			break;
		}
	}

	if ((!is_builtin && location != UINT32_MAX) || (is_builtin && ir_location != UINT32_MAX))
	{
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
		mark_location_as_used_by_shader(location, get<SPIRType>(mbr_type_id), storage);
		location += type_to_location_count(get<SPIRType>(mbr_type_id));
	}

	// Copy the component location, if present.
	if (has_member_decoration(var_type.self, mbr_idx, DecorationComponent))
	{
		uint32_t comp = get_member_decoration(var_type.self, mbr_idx, DecorationComponent);
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationComponent, comp);
	}

	// Mark the member as builtin if needed
	if (is_builtin)
	{
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationBuiltIn, builtin);
		if (builtin == BuiltInPosition && storage == StorageClassOutput)
			qual_pos_var_name = qual_var_name;
	}

	const SPIRConstant *c = nullptr;
	if (!flatten_stage_out && var.storage == StorageClassOutput &&
	    var.initializer != ID(0) && (c = maybe_get<SPIRConstant>(var.initializer)))
	{
		if (meta.strip_array)
		{
			entry_func.fixup_hooks_in.push_back([=, &var]() {
				auto &type = this->get<SPIRType>(var.basetype);
				uint32_t index = get_extended_member_decoration(var.self, mbr_idx, SPIRVCrossDecorationInterfaceMemberIndex);

				auto invocation = to_tesc_invocation_id();
				auto constant_chain = join(to_expression(var.initializer), "[", invocation, "]");
				statement(to_expression(stage_out_ptr_var_id), "[",
				          invocation, "].",
				          to_member_name(ib_type, index), " = ",
				          constant_chain, ".", to_member_name(type, mbr_idx), ";");
			});
		}
		else
		{
			entry_func.fixup_hooks_in.push_back([=]() {
				statement(qual_var_name, " = ", constant_expression(
						this->get<SPIRConstant>(c->subconstants[mbr_idx])), ";");
			});
		}
	}

	if (storage != StorageClassInput || !pull_model_inputs.count(var.self))
	{
		// Copy interpolation decorations if needed
		if (is_flat)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationFlat);
		if (is_noperspective)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationNoPerspective);
		if (is_centroid)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationCentroid);
		if (is_sample)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationSample);
	}

	set_extended_member_decoration(ib_type.self, ib_mbr_idx, SPIRVCrossDecorationInterfaceOrigID, var.self);
	set_extended_member_decoration(ib_type.self, ib_mbr_idx, SPIRVCrossDecorationInterfaceMemberIndex, var_mbr_idx);
}